

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_linkage_test.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ChaiScript_Basic chai;
  allocator<char> local_3ba;
  allocator<char> local_3b9;
  Exception_Handler local_3b8;
  string local_3a8;
  string local_388;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  ChaiScript_Basic local_328;
  
  create_chaiscript_stdlib();
  create_chaiscript_parser();
  local_348.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_368.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  chaiscript::default_options();
  chaiscript::ChaiScript_Basic::ChaiScript_Basic
            (&local_328,(ModulePtr *)&local_3a8,
             (unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
              *)&local_3b8,&local_348,&local_368,
             (vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> *)&local_388);
  std::_Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>::~_Vector_base
            ((_Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_> *)&local_388);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_368);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_348);
  if (local_3b8.
      super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    (**(code **)(*(long *)local_3b8.
                          super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 0x20))();
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_3a8._M_string_length);
  local_3b8.
  super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)do_something;
  chaiscript::
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<int(int),int(*)(int)>,int(*)(int)>
            ((chaiscript *)&local_3a8,(_func_int_int **)&local_3b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"do_something",&local_3ba)
  ;
  chaiscript::ChaiScript_Basic::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (&local_328,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&local_3a8,
             &local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_3a8._M_string_length);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"do_something(101)",&local_3ba);
  local_3b8.
  super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_3b8.
  super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"__EVAL__",&local_3b9);
  iVar1 = chaiscript::ChaiScript_Basic::eval<int>(&local_328,&local_388,&local_3b8,&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_3b8.
              super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_388);
  chaiscript::ChaiScript_Basic::~ChaiScript_Basic(&local_328);
  return (int)(iVar1 != 1);
}

Assistant:

int main() {
  chaiscript::ChaiScript_Basic chai(create_chaiscript_stdlib(), create_chaiscript_parser());
  chai.add(chaiscript::fun(&do_something), "do_something");

  return chai.eval<int>("do_something(101)") == 101 % 2 ? EXIT_SUCCESS : EXIT_FAILURE;
}